

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_units.cpp
# Opt level: O0

int ON_AngleUnitName::Internal_Compare(uint order_selector,ON_AngleUnitName *a,ON_AngleUnitName *b)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  int local_2c;
  uint j;
  uint i;
  ON_AngleUnitName *b_local;
  ON_AngleUnitName *a_local;
  uint order_selector_local;
  
  if (order_selector == 1) {
    if (a->m_locale_id < b->m_locale_id) {
      return -1;
    }
    if (b->m_locale_id < a->m_locale_id) {
      return 1;
    }
  }
  if (a->m_angle_unit_system < b->m_angle_unit_system) {
    a_local._4_4_ = -1;
  }
  else if (b->m_angle_unit_system < a->m_angle_unit_system) {
    a_local._4_4_ = 1;
  }
  else {
    if (order_selector != 1) {
      if (a->m_locale_id < b->m_locale_id) {
        return -1;
      }
      if (b->m_locale_id < a->m_locale_id) {
        return 1;
      }
    }
    local_2c = ON_wString::CompareOrdinal(a->m_name,b->m_name,false);
    if (local_2c == 0) {
      bVar2 = (a->m_bNameIsSingular & 1U) != 0;
      bVar3 = (b->m_bNameIsSingular & 1U) != 0;
      if (bVar2 < bVar3) {
        a_local._4_4_ = -1;
      }
      else if (bVar3 < bVar2) {
        a_local._4_4_ = 1;
      }
      else {
        bVar2 = (a->m_bNameIsPlural & 1U) != 0;
        bVar3 = (b->m_bNameIsPlural & 1U) != 0;
        if (bVar2 < bVar3) {
          a_local._4_4_ = -1;
        }
        else if (bVar3 < bVar2) {
          a_local._4_4_ = 1;
        }
        else {
          a_local._4_4_ = 0;
        }
      }
    }
    else {
      iVar1 = ON_wString::CompareOrdinal(a->m_name,b->m_name,true);
      if (iVar1 != 0) {
        local_2c = iVar1;
      }
      a_local._4_4_ = local_2c;
    }
  }
  return a_local._4_4_;
}

Assistant:

int ON_AngleUnitName::Internal_Compare(
  unsigned int order_selector,
  const ON_AngleUnitName& a,
  const ON_AngleUnitName& b
)
{
  if (1 == order_selector)
  {
    // locale id is first
    if (a.m_locale_id < b.m_locale_id)
      return -1;
    if (a.m_locale_id > b.m_locale_id)
      return 1;
  }

  unsigned int i = static_cast<unsigned int>(a.m_angle_unit_system);
  unsigned int j = static_cast<unsigned int>(b.m_angle_unit_system);
  if (i < j)
    return -1;
  if (i > j)
    return 1;

  if (1 != order_selector)
  {
    // localed id is second
    if (a.m_locale_id < b.m_locale_id)
      return -1;
    if (a.m_locale_id > b.m_locale_id)
      return 1;
  }

  i =  ON_wString::CompareOrdinal(a.m_name,b.m_name,false);
  if (i != 0)
  {
    // ignore case order is preferred
    j = ON_wString::CompareOrdinal(a.m_name, b.m_name, true);
    return (0 != j) ? j : i;
  }

  i = a.m_bNameIsSingular ? 1 : 0;
  j = b.m_bNameIsSingular ? 1 : 0;
  if (i < j)
    return -1;
  if (i > j)
    return 1;

  i = a.m_bNameIsPlural ? 1 : 0;
  j = b.m_bNameIsPlural ? 1 : 0;
  if (i < j)
    return -1;
  if (i > j)
    return 1;

  return 0;
}